

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

Image * Image_Function_Helper::Resize
                  (ResizeForm4 resize,Image *in,uint32_t widthOut,uint32_t heightOut)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined4 in_ECX;
  ImageTemplate<unsigned_char> *in_RDX;
  code *in_RSI;
  Image *in_RDI;
  undefined4 in_R8D;
  Image *out;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  Image *pIVar3;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffb8;
  
  pIVar3 = in_RDI;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            (in_stack_ffffffffffffffb8,(uint32_t)((ulong)pIVar3 >> 0x20),(uint32_t)pIVar3,
             (uint8_t)((ulong)in_RDI >> 0x38),(uint8_t)((ulong)in_RDI >> 0x30));
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  (*in_RSI)(in_RDX,0,0,uVar1,uVar2,pIVar3,0,0,in_ECX,in_R8D);
  return in_RDI;
}

Assistant:

Image Resize( FunctionTable::ResizeForm4 resize,
                  const Image & in, uint32_t widthOut, uint32_t heightOut )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( widthOut, heightOut );

        resize( in, 0, 0, in.width(), in.height(), out, 0, 0, widthOut, heightOut );

        return out;
    }